

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::negExpr(Parser *this)

{
  Report *this_00;
  bool bVar1;
  LiteralType args;
  SourceLocation *pSVar2;
  pointer pEVar3;
  FilePos *endPos;
  Parser *in_RSI;
  unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_> local_a0;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6e [6];
  undefined1 local_68 [2];
  Opcode op;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> e;
  undefined1 local_50 [8];
  SourceLocation loc;
  Parser *this_local;
  
  pSVar2 = location(in_RSI);
  SourceLocation::SourceLocation((SourceLocation *)local_50,pSVar2);
  bVar1 = consumeIf(in_RSI,Minus);
  if (bVar1) {
    negExpr((Parser *)local_68);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_68);
    if (bVar1) {
      pEVar3 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                         ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                          local_68);
      local_6e._0_2_ = makeOperator(Minus,pEVar3);
      if (local_6e._0_2_ == EXIT) {
        this_00 = in_RSI->report_;
        pSVar2 = lastLocation(in_RSI);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,
                   "Type cast error in unary \'neg\'-operator. Invalid source type <{}>.",&local_91)
        ;
        pEVar3 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                 operator->((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                            local_68);
        args = (*(pEVar3->super_ASTNode)._vptr_ASTNode[3])();
        diagnostics::Report::typeError<flow::LiteralType>(this_00,pSVar2,&local_90,args);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
        unique_ptr<std::default_delete<flow::lang::Expr>,void>
                  ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                   (nullptr_t)0x0);
      }
      else {
        endPos = end(in_RSI);
        SourceLocation::update((SourceLocation *)local_50,endPos);
        std::
        make_unique<flow::lang::UnaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                  ((Opcode *)&local_a0,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_6e,
                   (SourceLocation *)local_68);
        std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::operator=
                  ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)local_68,
                   &local_a0);
        std::unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_>::
        ~unique_ptr(&local_a0);
        std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::unique_ptr
                  ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)this,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_68)
        ;
      }
    }
    else {
      std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
      unique_ptr<std::default_delete<flow::lang::Expr>,void>
                ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                 (nullptr_t)0x0);
    }
    local_6e._2_4_ = 1;
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
              ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_68);
  }
  else {
    bitNotExpr(this);
    local_6e._2_4_ = 1;
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_50);
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::negExpr() {
  // negExpr ::= ['-'] primaryExpr
  SourceLocation loc = location();

  if (consumeIf(Token::Minus)) {
    std::unique_ptr<Expr> e = negExpr();
    if (!e) return nullptr;

    Opcode op = makeOperator(Token::Minus, e.get());
    if (op == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Type cast error in unary 'neg'-operator. Invalid source type <{}>.",
          e->getType());
      return nullptr;
    }

    e = std::make_unique<UnaryExpr>(op, std::move(e), loc.update(end()));
    return e;
  } else {
    return bitNotExpr();
  }
}